

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O0

int createRowConstraints
              (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *coverMatrix,int header)

{
  reference this;
  reference local_38;
  int local_24;
  int local_20;
  int index;
  int column;
  int n;
  int row;
  int header_local;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *coverMatrix_local;
  
  n = header;
  _row = coverMatrix;
  for (column = 1; column < 10; column = column + 1) {
    for (index = 1; index < 10; index = index + 1) {
      for (local_20 = 1; local_20 < 10; local_20 = local_20 + 1) {
        local_24 = indexInCoverMatrix(column,local_20,index);
        this = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::operator[](_row,(long)local_24);
        local_38 = std::vector<bool,_std::allocator<bool>_>::operator[](this,(long)n);
        std::_Bit_reference::operator=(&local_38,true);
      }
      n = n + 1;
    }
  }
  return n;
}

Assistant:

int createRowConstraints(vector<vector<bool>> &coverMatrix, int header){
    for (int row = COVER_START_INDEX; row <= SIZE; row++) {
      for (int n = COVER_START_INDEX; n <= SIZE; n++, header++) {
        for (int column = COVER_START_INDEX; column <= SIZE; column++) {
            int index = indexInCoverMatrix(row, column, n);
            
            coverMatrix[index][header] = true;
        }
      }
    }

    return header;
}